

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O2

void __thiscall efsw::FileWatcherInotify::watch(FileWatcherInotify *this)

{
  Thread *this_00;
  
  if (this->mThread != (Thread *)0x0) {
    return;
  }
  this_00 = (Thread *)operator_new(0x18);
  Thread::Thread<efsw::FileWatcherInotify>(this_00,0x10b51c,(FileWatcherInotify *)0x0);
  this->mThread = this_00;
  (*this_00->_vptr_Thread[2])(this_00);
  return;
}

Assistant:

void FileWatcherInotify::watch() {
	if ( NULL == mThread ) {
		mThread = new Thread( &FileWatcherInotify::run, this );
		mThread->launch();
	}
}